

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

int __thiscall MeCab::anon_unknown_0::TaggerImpl::lattice_level(TaggerImpl *this)

{
  uint uVar1;
  
  uVar1 = 2;
  if ((this->request_type_ & 8U) == 0) {
    uVar1 = (uint)this->request_type_ >> 1 & 1;
  }
  return uVar1;
}

Assistant:

int TaggerImpl::lattice_level() const {
  if (request_type_ & MECAB_MARGINAL_PROB) {
    return 2;
  } else if (request_type_ & MECAB_NBEST) {
    return 1;
  } else {
    return 0;
  }
}